

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

float deqp::gles3::Performance::vectorFloatRelativeStandardDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  float fVar1;
  float y;
  vector<long,_std::allocator<long>_> *v_local;
  
  fVar1 = vectorFloatStandardDeviation<long>(v);
  y = vectorFloatAverage<long>(v);
  fVar1 = hackySafeRelativeResult(fVar1,y);
  return fVar1;
}

Assistant:

static float vectorFloatRelativeStandardDeviation (const vector<T>& v)
{
	return hackySafeRelativeResult(vectorFloatStandardDeviation(v), vectorFloatAverage(v));
}